

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O0

void free_worm(level *lev)

{
  wseg *pwVar1;
  wseg *temp;
  wseg *curr;
  int i;
  level *lev_local;
  
  for (curr._4_4_ = 1; curr._4_4_ < 0x20; curr._4_4_ = curr._4_4_ + 1) {
    temp = lev->wtails[curr._4_4_];
    if (temp != (wseg *)0x0) {
      while (temp != (wseg *)0x0) {
        pwVar1 = temp->nseg;
        free(temp);
        temp = pwVar1;
      }
      lev->wtails[curr._4_4_] = (wseg *)0x0;
      lev->wheads[curr._4_4_] = (wseg *)0x0;
    }
  }
  return;
}

Assistant:

void free_worm(struct level *lev)
{
    int i;
    struct wseg *curr, *temp;

    /* Free the segments only.  free_monchn() will take care of the
     * monsters. */
    for (i = 1; i < MAX_NUM_WORMS; i++) {
	if (!(curr = lev->wtails[i])) continue;

	while (curr) {
	    temp = curr->nseg;
	    free(curr);		/* free the segment */
	    curr = temp;
	}
	lev->wheads[i] = lev->wtails[i] = NULL;
    }
}